

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportFileGenerator::PopulateCxxModuleExportProperties
          (cmExportFileGenerator *this,cmGeneratorTarget *gte,ImportPropertyMap *properties,
          PreprocessContext ctx,string *includesDestinationDirs,string *errorMessage)

{
  cmTarget *pcVar1;
  bool bVar2;
  cmMakefile *pcVar3;
  cmValue cVar4;
  mapped_type *pmVar5;
  ModulePropertyTable *propEntry;
  long lVar6;
  static_string_view *psVar7;
  string propNameStr_1;
  static_string_view exportedLinkModuleProperties [1];
  static_string_view exportedDirectModuleProperties [1];
  ModulePropertyTable exportedModuleProperties [4];
  string value;
  string exportedPropName;
  
  bVar2 = cmGeneratorTarget::HaveCxx20ModuleSources(gte,errorMessage);
  if (bVar2) {
    exportedDirectModuleProperties[0].super_string_view._M_len = 0xe;
    exportedDirectModuleProperties[0].super_string_view._M_str = "CXX_EXTENSIONS";
    for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 0x10) {
      std::__cxx11::string::string<cm::static_string_view,void>
                ((string *)exportedModuleProperties,
                 (static_string_view *)
                 ((long)&exportedDirectModuleProperties[0].super_string_view._M_len + lVar6),
                 (allocator<char> *)&propNameStr_1);
      pcVar1 = gte->Target;
      pcVar3 = cmTarget::GetMakefile(pcVar1);
      cVar4 = cmTarget::GetComputedProperty(pcVar1,(string *)exportedModuleProperties,pcVar3);
      if (cVar4.Value == (string *)0x0) {
        cVar4 = cmTarget::GetProperty(gte->Target,(string *)exportedModuleProperties);
        if (cVar4.Value != (string *)0x0) goto LAB_003dc2c5;
      }
      else {
LAB_003dc2c5:
        cmGeneratorExpression::Preprocess(&propNameStr_1,cVar4.Value,ctx,false);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,(string *)exportedModuleProperties);
        std::__cxx11::string::operator=((string *)pmVar5,(string *)&propNameStr_1);
        std::__cxx11::string::~string((string *)&propNameStr_1);
      }
      std::__cxx11::string::~string((string *)exportedModuleProperties);
    }
    exportedModuleProperties[0].Name.super_string_view._M_len = 0x13;
    exportedModuleProperties[0].Name.super_string_view._M_str = "INCLUDE_DIRECTORIES";
    exportedModuleProperties[0].Type = IncludePaths;
    exportedModuleProperties[1].Name.super_string_view._M_len = 0x13;
    exportedModuleProperties[1].Name.super_string_view._M_str = "COMPILE_DEFINITIONS";
    exportedModuleProperties[1].Type = Strings;
    exportedModuleProperties[2].Name.super_string_view._M_len = 0xf;
    exportedModuleProperties[2].Name.super_string_view._M_str = "COMPILE_OPTIONS";
    exportedModuleProperties[2].Type = Strings;
    exportedModuleProperties[3].Name.super_string_view._M_len = 0x10;
    exportedModuleProperties[3].Name.super_string_view._M_str = "COMPILE_FEATURES";
    exportedModuleProperties[3].Type = Strings;
    for (lVar6 = 0; lVar6 != 0x60; lVar6 = lVar6 + 0x18) {
      psVar7 = (static_string_view *)
               ((long)&exportedModuleProperties[0].Name.super_string_view._M_len + lVar6);
      std::__cxx11::string::string<cm::static_string_view,void>
                ((string *)&propNameStr_1,psVar7,(allocator<char> *)&exportedPropName);
      pcVar1 = gte->Target;
      pcVar3 = cmTarget::GetMakefile(pcVar1);
      cVar4 = cmTarget::GetComputedProperty(pcVar1,&propNameStr_1,pcVar3);
      if (cVar4.Value == (string *)0x0) {
        cVar4 = cmTarget::GetProperty(gte->Target,&propNameStr_1);
        if (cVar4.Value != (string *)0x0) goto LAB_003dc3f5;
      }
      else {
LAB_003dc3f5:
        cmStrCat<char_const(&)[22],cm::static_string_view_const&>
                  (&exportedPropName,(char (*) [22])0x6fdca4,psVar7);
        cmGeneratorExpression::Preprocess(&value,cVar4.Value,ctx,false);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,&exportedPropName);
        std::__cxx11::string::operator=((string *)pmVar5,(string *)&value);
        std::__cxx11::string::~string((string *)&value);
        if ((ctx == InstallInterface) &&
           (*(int *)((long)&exportedModuleProperties[0].Type + lVar6) - 1U < 2)) {
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](properties,&exportedPropName);
          (*this->_vptr_cmExportFileGenerator[0x14])(this,pmVar5);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](properties,&exportedPropName);
          prefixItems(pmVar5);
          if ((*(int *)((long)&exportedModuleProperties[0].Type + lVar6) == 2) &&
             (includesDestinationDirs->_M_string_length != 0)) {
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](properties,&exportedPropName);
            if (pmVar5->_M_string_length != 0) {
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](properties,&exportedPropName);
              std::__cxx11::string::push_back((char)pmVar5);
            }
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](properties,&exportedPropName);
            std::__cxx11::string::append((string *)pmVar5);
          }
        }
        std::__cxx11::string::~string((string *)&exportedPropName);
      }
      std::__cxx11::string::~string((string *)&propNameStr_1);
    }
    exportedLinkModuleProperties[0].super_string_view._M_len = 0xe;
    exportedLinkModuleProperties[0].super_string_view._M_str = "LINK_LIBRARIES";
    for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 0x10) {
      psVar7 = (static_string_view *)
               ((long)&exportedLinkModuleProperties[0].super_string_view._M_len + lVar6);
      std::__cxx11::string::string<cm::static_string_view,void>
                ((string *)&propNameStr_1,psVar7,(allocator<char> *)&exportedPropName);
      pcVar1 = gte->Target;
      pcVar3 = cmTarget::GetMakefile(pcVar1);
      cVar4 = cmTarget::GetComputedProperty(pcVar1,&propNameStr_1,pcVar3);
      if (cVar4.Value == (string *)0x0) {
        cVar4 = cmTarget::GetProperty(gte->Target,&propNameStr_1);
        if (cVar4.Value != (string *)0x0) goto LAB_003dc58e;
      }
      else {
LAB_003dc58e:
        cmStrCat<char_const(&)[22],cm::static_string_view_const&>
                  (&exportedPropName,(char (*) [22])0x6fdca4,psVar7);
        cmGeneratorExpression::Preprocess(&value,cVar4.Value,ctx,false);
        ResolveTargetsInGeneratorExpressions(this,&value,gte,ReplaceFreeTargets);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,&exportedPropName);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        std::__cxx11::string::~string((string *)&value);
        std::__cxx11::string::~string((string *)&exportedPropName);
      }
      std::__cxx11::string::~string((string *)&propNameStr_1);
    }
  }
  return true;
}

Assistant:

bool cmExportFileGenerator::PopulateCxxModuleExportProperties(
  cmGeneratorTarget const* gte, ImportPropertyMap& properties,
  cmGeneratorExpression::PreprocessContext ctx,
  std::string const& includesDestinationDirs, std::string& errorMessage)
{
  if (!gte->HaveCxx20ModuleSources(&errorMessage)) {
    return true;
  }

  const cm::static_string_view exportedDirectModuleProperties[] = {
    "CXX_EXTENSIONS"_s,
  };
  for (auto const& propName : exportedDirectModuleProperties) {
    auto const propNameStr = std::string(propName);
    cmValue prop = gte->Target->GetComputedProperty(
      propNameStr, *gte->Target->GetMakefile());
    if (!prop) {
      prop = gte->Target->GetProperty(propNameStr);
    }
    if (prop) {
      properties[propNameStr] = cmGeneratorExpression::Preprocess(*prop, ctx);
    }
  }

  const ModulePropertyTable exportedModuleProperties[] = {
    { "INCLUDE_DIRECTORIES"_s, PropertyType::IncludePaths },
    { "COMPILE_DEFINITIONS"_s, PropertyType::Strings },
    { "COMPILE_OPTIONS"_s, PropertyType::Strings },
    { "COMPILE_FEATURES"_s, PropertyType::Strings },
  };
  for (auto const& propEntry : exportedModuleProperties) {
    auto const propNameStr = std::string(propEntry.Name);
    cmValue prop = gte->Target->GetComputedProperty(
      propNameStr, *gte->Target->GetMakefile());
    if (!prop) {
      prop = gte->Target->GetProperty(propNameStr);
    }
    if (prop) {
      auto const exportedPropName =
        cmStrCat("IMPORTED_CXX_MODULES_", propEntry.Name);
      properties[exportedPropName] =
        cmGeneratorExpression::Preprocess(*prop, ctx);
      if (ctx == cmGeneratorExpression::InstallInterface &&
          PropertyTypeIsForPaths(propEntry.Type)) {
        this->ReplaceInstallPrefix(properties[exportedPropName]);
        prefixItems(properties[exportedPropName]);
        if (propEntry.Type == PropertyType::IncludePaths &&
            !includesDestinationDirs.empty()) {
          if (!properties[exportedPropName].empty()) {
            properties[exportedPropName] += ';';
          }
          properties[exportedPropName] += includesDestinationDirs;
        }
      }
    }
  }

  const cm::static_string_view exportedLinkModuleProperties[] = {
    "LINK_LIBRARIES"_s,
  };
  for (auto const& propName : exportedLinkModuleProperties) {
    auto const propNameStr = std::string(propName);
    cmValue prop = gte->Target->GetComputedProperty(
      propNameStr, *gte->Target->GetMakefile());
    if (!prop) {
      prop = gte->Target->GetProperty(propNameStr);
    }
    if (prop) {
      auto const exportedPropName =
        cmStrCat("IMPORTED_CXX_MODULES_", propName);
      auto value = cmGeneratorExpression::Preprocess(*prop, ctx);
      this->ResolveTargetsInGeneratorExpressions(
        value, gte, cmExportFileGenerator::ReplaceFreeTargets);
      properties[exportedPropName] = value;
    }
  }

  return true;
}